

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsFontScaler.cpp
# Opt level: O2

void __thiscall KDReports::FontScaler::setFactorForHeight(FontScaler *this,qreal wantedHeight)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  
  if (wantedHeight <= 0.0) {
    qt_assert("wantedHeight > 0",
              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsFontScaler.cpp"
              ,0x52);
  }
  dVar3 = (double)QFontMetricsF::height();
  uVar2 = 0;
  while( true ) {
    if (dVar3 <= wantedHeight) {
      return;
    }
    if (dVar3 <= 3.0) break;
    applyAdditionalScalingFactor(this,wantedHeight / dVar3);
    dVar4 = (double)QFontMetricsF::height();
    if (9 < uVar2) {
      if ((dVar4 == dVar3) && (!NAN(dVar4) && !NAN(dVar3))) {
        return;
      }
    }
    uVar2 = uVar2 + 1;
    iVar1 = QFont::pixelSize();
    dVar3 = dVar4;
    if (iVar1 == 1) {
      return;
    }
  }
  return;
}

Assistant:

void FontScaler::setFactorForHeight(qreal wantedHeight)
{
#ifdef DEBUG_LAYOUT
    qDebug() << " FontScaler::setFactorForHeight" << wantedHeight;
#endif
    Q_ASSERT(wantedHeight > 0);
    qreal height = m_fontMetrics.height();
    int iterations = 0;

    while (height > wantedHeight && height > 3.0 /* seems to be the min we can get */) {
        const qreal factor = wantedHeight / height;
        applyAdditionalScalingFactor(factor);
        qreal prevHeight = height;
        height = m_fontMetrics.height();
#ifdef DEBUG_LAYOUT
        qDebug() << " FontScaler: height=" << height << factor << m_scalingFactor;
#endif
        if (++iterations > 10 && height == prevHeight) {
            // We're not getting anywhere, probably we're hitting a minimum width when
            // trying to use a very, very small font (see unittest testFontScalerVerySmall)
            break;
        }
        if (m_font.pixelSize() == 1) {
            break;
        }
    }
}